

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void glslang::SpecialQualifier
               (char *name,TStorageQualifier qualifier,TBuiltInVariable builtIn,
               TSymbolTable *symbolTable)

{
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  long lVar3;
  TQualifier *symQualifier;
  TString local_50;
  TSymbol *local_28;
  TSymbol *symbol;
  TSymbolTable *symbolTable_local;
  TBuiltInVariable builtIn_local;
  TStorageQualifier qualifier_local;
  char *name_local;
  
  symbol = (TSymbol *)symbolTable;
  symbolTable_local._0_4_ = builtIn;
  symbolTable_local._4_4_ = qualifier;
  _builtIn_local = name;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&symQualifier);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             name,(pool_allocator<char> *)&symQualifier);
  pTVar2 = TSymbolTable::find(symbolTable,&local_50,(bool *)0x0,(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_50);
  if (pTVar2 != (TSymbol *)0x0) {
    local_28 = pTVar2;
    iVar1 = (*pTVar2->_vptr_TSymbol[0xd])();
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))();
    *(ulong *)(lVar3 + 8) =
         *(ulong *)(lVar3 + 8) & 0xffffffffffffff80 | (ulong)symbolTable_local._4_4_ & 0x7f;
    *(ulong *)(lVar3 + 8) =
         *(ulong *)(lVar3 + 8) & 0xffffffffffff007f |
         ((ulong)(TBuiltInVariable)symbolTable_local & 0x1ff) << 7;
  }
  return;
}

Assistant:

static void SpecialQualifier(const char* name, TStorageQualifier qualifier, TBuiltInVariable builtIn, TSymbolTable& symbolTable)
{
    TSymbol* symbol = symbolTable.find(name);
    if (symbol == nullptr)
        return;

    TQualifier& symQualifier = symbol->getWritableType().getQualifier();
    symQualifier.storage = qualifier;
    symQualifier.builtIn = builtIn;
}